

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O2

char * xml_element_name(xml_element_tag tag)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  
  if (tag != no_element) {
    pcVar3 = xml_full_element_name[tag];
    do {
      pcVar1 = pcVar3 + 1;
      cVar2 = *pcVar3;
      pcVar3 = pcVar1;
    } while (cVar2 != ' ');
    return pcVar1;
  }
  return "--none--";
}

Assistant:

static const char *xml_element_name(xml_element_tag tag)
{
    const char *str;

    if (tag == no_element)
    {
        return "--none--";
    }

    str = xml_full_element_name[tag];
    while (*str != ' ')
    {
        str++;
    }
    str++;
    return str;
}